

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall WELL44497b::test_method(WELL44497b *this)

{
  bool bVar1;
  char *pcStack_1730;
  char *pcStack_1728;
  result_type arStack_1720 [2];
  undefined8 uStack_1718;
  shared_count sStack_1710;
  undefined **ppuStack_1708;
  undefined1 uStack_1700;
  undefined8 *puStack_16f8;
  char **ppcStack_16f0;
  char *pcStack_16e8;
  char *pcStack_16e0;
  char *pcStack_16d8;
  char *pcStack_16d0;
  undefined1 *puStack_16c8;
  undefined1 *puStack_16c0;
  char *pcStack_16b8;
  char *pcStack_16b0;
  char *pcStack_16a8;
  char *pcStack_16a0;
  undefined1 *puStack_1698;
  undefined1 *puStack_1690;
  char *pcStack_1688;
  char *pcStack_1680;
  char *pcStack_1678;
  char *pcStack_1670;
  undefined1 *puStack_1668;
  undefined1 *puStack_1660;
  char *pcStack_1658;
  char *pcStack_1650;
  char *pcStack_1648;
  char *pcStack_1640;
  undefined1 *puStack_1638;
  undefined1 *puStack_1630;
  char *pcStack_1628;
  char *pcStack_1620;
  undefined1 *puStack_1618;
  undefined1 *puStack_1610;
  char *pcStack_1608;
  char *pcStack_1600;
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  wStack_15f8;
  
  boost::random::
  well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
  ::seed(&wStack_15f8);
  pcStack_1608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1600 = "";
  puStack_1618 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1610 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1608,0x43);
  uStack_1700 = 0;
  ppuStack_1708 = &PTR__lazy_ostream_00132d30;
  puStack_16f8 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_16f0 = (char **)0x12901a;
  pcStack_16e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16e0 = "";
  arStack_1720[0] =
       WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
       ::generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
                   *)&wStack_15f8);
  pcStack_1730._0_4_ = 0x9406547b;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&ppuStack_1708,&pcStack_16e8,0x43,1,2,arStack_1720,"c.generate()",&pcStack_1730,
             "Expected");
  pcStack_1628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1620 = "";
  puStack_1638 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1630 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1628,0x44);
  uStack_1700 = 0;
  ppuStack_1708 = &PTR__lazy_ostream_00132d30;
  puStack_16f8 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_16f0 = (char **)0x12901a;
  pcStack_1648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  arStack_1720[0] = 0;
  pcStack_1640 = "";
  pcStack_1730._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&ppuStack_1708,&pcStack_1648,0x44,1,2,arStack_1720,"c.rng.min()",&pcStack_1730,"0U");
  pcStack_1658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1650 = "";
  puStack_1668 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1660 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1658,0x45);
  uStack_1700 = 0;
  ppuStack_1708 = &PTR__lazy_ostream_00132d30;
  puStack_16f8 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_16f0 = (char **)0x12901a;
  pcStack_1678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  arStack_1720[0] = 0xffffffff;
  pcStack_1670 = "";
  pcStack_1730 = (char *)CONCAT44(pcStack_1730._4_4_,0xffffffff);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&ppuStack_1708,&pcStack_1678,0x45,1,2,arStack_1720,"c.rng.max()",&pcStack_1730,"~0U");
  pcStack_1688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_1680 = "";
  puStack_1698 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1690 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1688,0x46);
  uStack_1700 = 0;
  ppuStack_1708 = &PTR__lazy_ostream_00132d30;
  puStack_16f8 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_16f0 = (char **)0x12901a;
  pcStack_16a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16a0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::random::well_engine<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,boost::random::detail::M3<_24>,boost::random::detail::M3<30>,boost::random::detail::M3<_10>,boost::random::detail::M2<_26>,boost::random::detail::M1,boost::random::detail::M3<20>,boost::random::detail::M6<32ul,9u,5u,14u,3072982252u>,boost::random::detail::M1,boost::random::detail::matsumoto_kurita_tempering<2480739328u,4195450880u>>,boost::random::well_engine<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,boost::random::detail::M3<_24>,boost::random::detail::M3<30>,boost::random::detail::M3<_10>,boost::random::detail::M2<_26>,boost::random::detail::M1,boost::random::detail::M3<20>,boost::random::detail::M6<32ul,9u,5u,14u,3072982252u>,boost::random::detail::M1,boost::random::detail::matsumoto_kurita_tempering<2480739328u,4195450880u>>>
            (&ppuStack_1708,&pcStack_16a8,0x46,1,2,&wStack_15f8,"c.rng",&wStack_15f8,"c.rng");
  pcStack_16b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16b0 = "";
  puStack_16c8 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_16c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_16b8,0x47);
  bVar1 = boost::random::operator==(&wStack_15f8,&wStack_15f8);
  arStack_1720[0] = CONCAT31(arStack_1720[0]._1_3_,bVar1);
  uStack_1718 = 0;
  sStack_1710.pi_ = (sp_counted_base *)0x0;
  pcStack_1730 = "c.rng == c.rng";
  pcStack_1728 = "";
  uStack_1700 = 0;
  ppuStack_1708 = &PTR__lazy_ostream_001327c0;
  puStack_16f8 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_16f0 = &pcStack_1730;
  pcStack_16d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp";
  pcStack_16d0 = "";
  boost::test_tools::tt_detail::report_assertion
            (arStack_1720,&ppuStack_1708,&pcStack_16d8,0x47,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1710);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(abc)
{
    typedef boost::random::well512a RandomNumberGenerator;
    RandomNumberGenerator rng;

    unsigned state[RandomNumberGenerator::state_size] = {};
    state[RandomNumberGenerator::state_size - 1] = 1;

    unsigned* p = state;
    rng.seed(p, boost::end(state));

    unsigned x;

    int iterations = 9999;

    while (iterations-- > 0)
        x = rng();

    BOOST_CHECK_EQUAL(x, 0x4df08652U);
}